

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

String * __thiscall
Json::writeString_abi_cxx11_(String *__return_storage_ptr__,Json *this,Factory *factory,Value *root)

{
  pointer pSVar1;
  unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> local_1a0;
  StreamWriterPtr writer;
  OStringStream sout;
  Value *root_local;
  Factory *factory_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&writer);
  pSVar1 = (pointer)(**(code **)(*(long *)this + 0x10))();
  std::unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>>::
  unique_ptr<std::default_delete<Json::StreamWriter>,void>
            ((unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>> *)&local_1a0,
             pSVar1);
  pSVar1 = std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::operator->
                     (&local_1a0);
  (*pSVar1->_vptr_StreamWriter[2])(pSVar1,factory,&writer);
  std::__cxx11::ostringstream::str();
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
            (&local_1a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&writer);
  return __return_storage_ptr__;
}

Assistant:

String writeString(StreamWriter::Factory const& factory, Value const& root) {
  OStringStream sout;
  StreamWriterPtr const writer(factory.newStreamWriter());
  writer->write(root, &sout);
  return sout.str();
}